

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_reader.cpp
# Opt level: O3

bool __thiscall argo::stream_reader::read_next_block(stream_reader *this)

{
  istream *piVar1;
  long lVar2;
  json_io_exception *this_00;
  int *piVar3;
  
  std::istream::read((char *)this->m_stream,(long)(this->super_reader).m_block);
  piVar1 = this->m_stream;
  lVar2 = *(long *)(piVar1 + 8);
  if (lVar2 < 1) {
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 2) == 0) {
      this_00 = (json_io_exception *)__cxa_allocate_exception(0xd8);
      piVar3 = __errno_location();
      json_io_exception::json_io_exception(this_00,read_failed_e,*piVar3);
      __cxa_throw(this_00,&json_io_exception::typeinfo,std::exception::~exception);
    }
  }
  else {
    (this->super_reader).m_block_num_bytes = (int)lVar2;
    (this->super_reader).m_block_index = 0;
  }
  return 0 < lVar2;
}

Assistant:

bool stream_reader::read_next_block()
{
    m_stream->read(reinterpret_cast<char *>(m_block), block_size);

    streamsize n = m_stream->gcount();

    if (n > 0)
    {
        m_block_num_bytes = static_cast<int>(n);
        m_block_index = 0;
        return true;
    }
    else
    {
        if (m_stream->eof())
        {
            return false;
        }
        else
        {
            throw json_io_exception(json_io_exception::read_failed_e, errno);
        }
    }
}